

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O1

void ELFIO::dump::dynamic_tag
               (ostream *out,Elf_Xword no,Elf_Xword tag,Elf_Xword value,string *str,uint param_6)

{
  long lVar1;
  long lVar2;
  unsigned_long *key;
  ostream oVar3;
  ostream *poVar4;
  ostream *poVar5;
  string local_58;
  Elf_Xword local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  lVar1 = *(long *)out;
  *(undefined8 *)(out + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar5 = out + lVar1;
  if (out[lVar1 + 0xe1] == (ostream)0x0) {
    oVar3 = (ostream)std::ios::widen((char)poVar5);
    poVar5[0xe0] = oVar3;
    poVar5[0xe1] = (ostream)0x1;
  }
  poVar5[0xe0] = (ostream)0x20;
  lVar1 = *(long *)out;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffffb5 | 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(out + lVar1 + 0x18) = *(uint *)(out + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
  lVar1 = *(long *)poVar4;
  *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0x10;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar5 = poVar4 + lVar1;
  if (poVar4[lVar1 + 0xe1] == (ostream)0x0) {
    oVar3 = (ostream)std::ios::widen((char)poVar5);
    poVar5[0xe0] = oVar3;
    poVar5[0xe1] = (ostream)0x1;
  }
  poVar5[0xe0] = (ostream)0x20;
  lVar1 = *(long *)poVar4;
  key = *(unsigned_long **)(lVar1 + -0x18);
  *(uint *)(poVar4 + 0x18 + (long)key) = *(uint *)(poVar4 + 0x18 + (long)key) & 0xffffffb5 | 8;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x20;
  local_38 = tag;
  format_assoc<ELFIO::dynamic_tag_t[55],unsigned_long>
            (&local_58,(dump *)dynamic_tag_table,(dynamic_tag_t (*) [55])&local_38,key);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (str->_M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"0x",2);
    lVar1 = *(long *)out;
    *(undefined8 *)(out + *(long *)(lVar1 + -0x18) + 0x10) = 0x10;
    lVar1 = *(long *)(lVar1 + -0x18);
    poVar5 = out + lVar1;
    if (out[lVar1 + 0xe1] == (ostream)0x0) {
      oVar3 = (ostream)std::ios::widen((char)poVar5);
      poVar5[0xe0] = oVar3;
      poVar5[0xe1] = (ostream)0x1;
    }
    poVar5[0xe0] = (ostream)0x30;
    lVar1 = *(long *)out;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(out + lVar1 + 0x18) = *(uint *)(out + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  }
  else {
    lVar1 = *(long *)out;
    *(undefined8 *)(out + *(long *)(lVar1 + -0x18) + 0x10) = 0x20;
    lVar1 = *(long *)(lVar1 + -0x18);
    poVar5 = out + lVar1;
    if (out[lVar1 + 0xe1] == (ostream)0x0) {
      oVar3 = (ostream)std::ios::widen((char)poVar5);
      poVar5[0xe0] = oVar3;
      poVar5[0xe1] = (ostream)0x1;
    }
    poVar5[0xe0] = (ostream)0x20;
    lVar1 = *(long *)out;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(out + lVar1 + 0x18) = *(uint *)(out + lVar1 + 0x18) & 0xffffff4f | 0x20;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(str->_M_dataplus)._M_p,str->_M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

static void dynamic_tag( std::ostream&      out,
                             Elf_Xword          no,
                             Elf_Xword          tag,
                             Elf_Xword          value,
                             const std::string& str,
                             unsigned int /*elf_class*/ )
    {
        out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
            << DUMP_STR_FORMAT( 16 ) << str_dynamic_tag( tag ) << " ";
        if ( str.empty() ) {
            out << DUMP_HEX0x_FORMAT( 16 ) << value << " ";
        }
        else {
            out << DUMP_STR_FORMAT( 32 ) << str << " ";
        }
        out << std::endl;
    }